

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

iterator __thiscall
QHash<QString,VcsolutionDepend*>::emplace<VcsolutionDepend*const&>
          (QHash<QString,VcsolutionDepend*> *this,QString *key,VcsolutionDepend **args)

{
  Data<QHashPrivate::Node<QString,_VcsolutionDepend_*>_> *pDVar1;
  VcsolutionDepend *pVVar2;
  long in_FS_OFFSET;
  piter pVar3;
  QHash<QString,_VcsolutionDepend_*> local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pVVar2 = *(VcsolutionDepend **)this;
  if (pVVar2 == (VcsolutionDepend *)0x0) {
    local_28.d = (Data *)0x0;
LAB_00250f53:
    pVVar2 = (VcsolutionDepend *)0x0;
LAB_00250f74:
    pDVar1 = QHashPrivate::Data<QHashPrivate::Node<QString,_VcsolutionDepend_*>_>::detached
                       ((Data<QHashPrivate::Node<QString,_VcsolutionDepend_*>_> *)pVVar2);
    *(Data<QHashPrivate::Node<QString,_VcsolutionDepend_*>_> **)this = pDVar1;
  }
  else {
    if (*(uint *)&(pVVar2->uuid).d.d < 2) {
      if ((pVVar2->uuid).d.ptr < (char16_t *)((ulong)(pVVar2->uuid).d.size >> 1)) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
          pVar3 = (piter)emplace_helper<VcsolutionDepend*const&>(this,key,args);
          return (iterator)pVar3;
        }
      }
      else {
        local_28.d = (Data *)*args;
        pVar3 = (piter)emplace_helper<VcsolutionDepend*>(this,key,(VcsolutionDepend **)&local_28);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
          return (iterator)pVar3;
        }
      }
      goto LAB_00250fdc;
    }
    local_28.d = (Data *)pVVar2;
    if (*(int *)&(pVVar2->uuid).d.d != -1) {
      LOCK();
      *(int *)&(pVVar2->uuid).d.d = *(int *)&(pVVar2->uuid).d.d + 1;
      UNLOCK();
      pVVar2 = *(VcsolutionDepend **)this;
      if (pVVar2 == (VcsolutionDepend *)0x0) goto LAB_00250f53;
    }
    if (1 < *(uint *)&(pVVar2->uuid).d.d) goto LAB_00250f74;
  }
  pVar3 = (piter)emplace_helper<VcsolutionDepend*const&>(this,key,args);
  QHash<QString,_VcsolutionDepend_*>::~QHash(&local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (iterator)pVar3;
  }
LAB_00250fdc:
  __stack_chk_fail();
}

Assistant:

iterator emplace(Key &&key, Args &&... args)
    {
        if (isDetached()) {
            if (d->shouldGrow()) // Construct the value now so that no dangling references are used
                return emplace_helper(std::move(key), T(std::forward<Args>(args)...));
            return emplace_helper(std::move(key), std::forward<Args>(args)...);
        }
        // else: we must detach
        const auto copy = *this; // keep 'args' alive across the detach/growth
        detach();
        return emplace_helper(std::move(key), std::forward<Args>(args)...);
    }